

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::parseSpecialPosition
          (CollationRuleParser *this,int32_t i,UnicodeString *str,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t offset;
  UnicodeString *pUVar3;
  int iVar4;
  long lVar5;
  ConstChar16Ptr local_f0;
  ConstChar16Ptr local_e8;
  UErrorCode *local_e0;
  ulong local_d8;
  char16_t *local_d0;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString raw;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  raw.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  raw.fUnion.fStackFields.fLengthAndFlags = 2;
  offset = readWords(this,i + 1,&raw);
  if (((i < offset) && (cVar2 = UnicodeString::doCharAt(this->rules,offset), cVar2 == L']')) &&
     (0x1f < (ushort)raw.fUnion._0_2_)) {
    iVar4 = offset + 1;
    cVar2 = L'⠀';
    local_e0 = errorCode;
    local_d8 = (ulong)(uint)i;
    for (lVar5 = 0; lVar5 != 0x38; lVar5 = lVar5 + 4) {
      UnicodeString::UnicodeString
                (&local_b0,
                 (char *)((long)&_ZN6icu_6312_GLOBAL__N_19positionsE_rel +
                         (long)*(int *)((long)&_ZN6icu_6312_GLOBAL__N_19positionsE_rel + lVar5)),-1,
                 kInvariant);
      UVar1 = UnicodeString::operator==(&raw,&local_b0);
      UnicodeString::~UnicodeString(&local_b0);
      if (UVar1 != '\0') {
        pUVar3 = UnicodeString::setTo(str,L'\xfffe');
        UnicodeString::append(pUVar3,cVar2);
        goto LAB_002435ef;
      }
      cVar2 = cVar2 + L'\x01';
    }
    local_e8.p_ = L"top";
    UnicodeString::UnicodeString(&local_b0,'\x01',&local_e8,-1);
    UVar1 = UnicodeString::operator==(&raw,&local_b0);
    errorCode = local_e0;
    i = (int32_t)local_d8;
    UnicodeString::~UnicodeString(&local_b0);
    local_c0 = local_e8.p_;
    if (UVar1 == '\0') {
      local_f0.p_ = L"variable top";
      UnicodeString::UnicodeString(&local_b0,'\x01',&local_f0,-1);
      UVar1 = UnicodeString::operator==(&raw,&local_b0);
      UnicodeString::~UnicodeString(&local_b0);
      local_d0 = local_f0.p_;
      if (UVar1 == '\0') goto LAB_002435db;
      pUVar3 = UnicodeString::setTo(str,L'\xfffe');
      cVar2 = L'⠇';
    }
    else {
      pUVar3 = UnicodeString::setTo(str,L'\xfffe');
      cVar2 = L'⠉';
    }
    UnicodeString::append(pUVar3,cVar2);
  }
  else {
LAB_002435db:
    iVar4 = i;
    setParseError(this,"not a valid special reset position",errorCode);
  }
LAB_002435ef:
  UnicodeString::~UnicodeString(&raw);
  return iVar4;
}

Assistant:

int32_t
CollationRuleParser::parseSpecialPosition(int32_t i, UnicodeString &str, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeString raw;
    int32_t j = readWords(i + 1, raw);
    if(j > i && rules->charAt(j) == 0x5d && !raw.isEmpty()) {  // words end with ]
        ++j;
        for(int32_t pos = 0; pos < UPRV_LENGTHOF(positions); ++pos) {
            if(raw == UnicodeString(positions[pos], -1, US_INV)) {
                str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + pos));
                return j;
            }
        }
        if(raw == UNICODE_STRING_SIMPLE("top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_REGULAR));
            return j;
        }
        if(raw == UNICODE_STRING_SIMPLE("variable top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_VARIABLE));
            return j;
        }
    }
    setParseError("not a valid special reset position", errorCode);
    return i;
}